

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocations.cpp
# Opt level: O2

void Allocations::collectPoolStats(AllocationStats *stats)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  int64_t iVar4;
  
  p_Var3 = (_Base_ptr)stats->largestPoolSize;
  iVar4 = stats->totalPoolSize;
  for (p_Var2 = pools._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &pools._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    p_Var1 = p_Var2[1]._M_left;
    if ((long)p_Var3 < (long)p_Var1) {
      stats->largestPoolPosition = (int64_t)p_Var2[1]._M_parent;
      stats->largestPoolSize = (int64_t)p_Var1;
      p_Var3 = p_Var1;
    }
    iVar4 = (long)&p_Var1->_M_color + iVar4;
    stats->totalPoolSize = iVar4;
  }
  return;
}

Assistant:

void Allocations::collectPoolStats(AllocationStats &stats)
{
	for (auto it : pools)
	{
		if (it.second > stats.largestPoolSize)
		{
			stats.largestPoolPosition = it.first.position;
			stats.largestPoolSize = it.second;
		}

		stats.totalPoolSize += it.second;
	}
}